

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int EVP_HPKE_CTX_export(EVP_HPKE_CTX *ctx,uint8_t *out,size_t secret_len,uint8_t *context,
                       size_t context_len)

{
  int iVar1;
  EVP_MD *md;
  undefined4 extraout_var;
  EVP_MD *hkdf_md;
  uint8_t suite_id [10];
  size_t context_len_local;
  uint8_t *context_local;
  size_t secret_len_local;
  uint8_t *out_local;
  EVP_HPKE_CTX *ctx_local;
  
  suite_id._2_8_ = context_len;
  iVar1 = hpke_build_suite_id(ctx,(uint8_t *)((long)&hkdf_md + 6));
  if (iVar1 == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    md = (EVP_MD *)(*ctx->kdf->hkdf_md_func)();
    iVar1 = EVP_MD_size(md);
    iVar1 = hpke_labeled_expand((EVP_MD *)md,out,secret_len,ctx->exporter_secret,
                                CONCAT44(extraout_var,iVar1),(uint8_t *)((long)&hkdf_md + 6),10,
                                "sec",context,suite_id._2_8_);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int EVP_HPKE_CTX_export(const EVP_HPKE_CTX *ctx, uint8_t *out,
                        size_t secret_len, const uint8_t *context,
                        size_t context_len) {
  uint8_t suite_id[HPKE_SUITE_ID_LEN];
  if (!hpke_build_suite_id(ctx, suite_id)) {
    return 0;
  }
  const EVP_MD *hkdf_md = ctx->kdf->hkdf_md_func();
  if (!hpke_labeled_expand(hkdf_md, out, secret_len, ctx->exporter_secret,
                           EVP_MD_size(hkdf_md), suite_id, sizeof(suite_id),
                           "sec", context, context_len)) {
    return 0;
  }
  return 1;
}